

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

string * getUsage_abi_cxx11_(string *__return_storage_ptr__,char *argv_0)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  allocator local_19;
  
  std::__cxx11::string::string((string *)&local_100,argv_0,&local_19);
  std::operator+(&local_40,"usage:   ",&local_100);
  std::operator+(&local_60,&local_40," [options]\n");
  std::operator+(&local_80,&local_60,"options: -n <number of textures generate>\n");
  std::operator+(&local_a0,&local_80,"         -i <index of the first texure>\n");
  std::operator+(&local_c0,&local_a0,"         -d <output directory>\n");
  std::operator+(&local_e0,&local_c0,"         -t <texture type>\n");
  std::operator+(__return_storage_ptr__,&local_e0,"         -r <image resolution>\n");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_100);
  return __return_storage_ptr__;
}

Assistant:

const std::string getUsage(const char* argv_0)
{
    return \
        "usage:   " + std::string(argv_0) + " [options]\n" +
        "options: -n <number of textures generate>\n"  +
        "         -i <index of the first texure>\n" +
        "         -d <output directory>\n" +
        "         -t <texture type>\n" +
        "         -r <image resolution>\n";
}